

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O2

void __thiscall
ON_ClassArray<ON_SubDEdgePtr>::Append(ON_ClassArray<ON_SubDEdgePtr> *this,ON_SubDEdgePtr *x)

{
  ON__UINT_PTR OVar1;
  int iVar2;
  ON_SubDEdgePtr *pOVar3;
  int iVar4;
  
  iVar2 = this->m_count;
  if (iVar2 != this->m_capacity) {
    pOVar3 = this->m_a;
LAB_00611e00:
    this->m_count = iVar2 + 1;
    pOVar3[iVar2].m_ptr = x->m_ptr;
    return;
  }
  iVar2 = NewCapacity(this);
  if (((this->m_a == (ON_SubDEdgePtr *)0x0) ||
      (iVar4 = (int)((ulong)((long)x - (long)this->m_a) >> 3), iVar4 < 0)) ||
     (this->m_capacity <= iVar4)) {
    Reserve(this,(long)iVar2);
    pOVar3 = this->m_a;
    if (pOVar3 != (ON_SubDEdgePtr *)0x0) {
      iVar2 = this->m_count;
      goto LAB_00611e00;
    }
    iVar2 = 0x6c6;
  }
  else {
    OVar1 = x->m_ptr;
    Reserve(this,(long)iVar2);
    if (this->m_a != (ON_SubDEdgePtr *)0x0) {
      iVar2 = this->m_count;
      this->m_count = iVar2 + 1;
      this->m_a[iVar2].m_ptr = OVar1;
      return;
    }
    iVar2 = 0x6bc;
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
             ,iVar2,"","allocation failure");
  return;
}

Assistant:

void ON_ClassArray<T>::Append( const T& x ) 
{
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if (m_a)
    {
      const int s = (int)(&x - m_a); // (int) cast is for 64 bit pointers
      if ( s >= 0 && s < m_capacity )
      {
        // 26 Sep 2005 Dale Lear
        //    User passed in an element of the m_a[]
        //    that will get reallocated by the call
        //    to Reserve(newcapacity).
        T temp;   // ON_*Array<> templates do not require robust copy constructor.
        temp = x; // ON_*Array<> templates require a robust operator=.
        Reserve( newcapacity );
        if (nullptr == m_a)
        {
          ON_ERROR("allocation failure");
          return;
        }
        m_a[m_count++] = temp;
        return;
      }
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = x;
}